

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O0

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  IkReal x66;
  IkReal x65;
  IkReal x64;
  IkReal x63;
  IkReal x62;
  IkReal x61;
  IkReal x60;
  IkReal x59;
  IkReal x58;
  IkReal x57;
  IkReal x56;
  IkReal x55;
  IkReal x54;
  IkReal x53;
  IkReal x52;
  IkReal x51;
  IkReal x50;
  IkReal x49;
  IkReal x48;
  IkReal x47;
  IkReal x46;
  IkReal x45;
  IkReal x44;
  IkReal x43;
  IkReal x42;
  IkReal x41;
  IkReal x40;
  IkReal x39;
  IkReal x38;
  IkReal x37;
  IkReal x36;
  IkReal x35;
  IkReal x34;
  IkReal x33;
  IkReal x32;
  IkReal x31;
  IkReal x30;
  IkReal x29;
  IkReal x28;
  IkReal x27;
  IkReal x26;
  IkReal x25;
  IkReal x24;
  IkReal x23;
  IkReal x22;
  IkReal x21;
  IkReal x20;
  IkReal x19;
  IkReal x18;
  IkReal x17;
  IkReal x16;
  IkReal x15;
  IkReal x14;
  IkReal x13;
  IkReal x12;
  IkReal x11;
  IkReal x10;
  IkReal x9;
  IkReal x8;
  IkReal x7;
  IkReal x6;
  IkReal x5;
  IkReal x4;
  IkReal x3;
  IkReal x2;
  IkReal x1;
  IkReal x0;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IkReal *j_local;
  
  dVar1 = IKcos(*j);
  dVar2 = IKcos(j[3]);
  dVar3 = IKsin(*j);
  dVar4 = IKsin(j[3]);
  dVar5 = IKsin(j[4]);
  dVar6 = IKsin(j[1]);
  dVar7 = IKsin(j[2]);
  dVar8 = IKcos(j[1]);
  dVar9 = IKcos(j[2]);
  dVar10 = IKcos(j[4]);
  dVar11 = IKsin(j[5]);
  dVar12 = IKcos(j[5]);
  dVar13 = dVar5 * 0.134999999784;
  dVar14 = dVar5 * 5.39999999136e-06;
  dVar15 = dVar5 * 0.9999999992;
  dVar16 = dVar1 * 5.39999999136e-06;
  dVar17 = dVar1 * 0.175;
  dVar18 = dVar5 * 3.9999999968e-05;
  dVar19 = dVar10 * 5.39999999136e-06;
  dVar20 = dVar3 * 0.175;
  dVar21 = dVar10 * 0.134999999784;
  dVar22 = dVar10 * 3.9999999968e-05;
  dVar23 = dVar10 * 0.9999999992;
  dVar24 = dVar3 * 1.0;
  dVar25 = dVar1 * 2.159999996544e-10;
  dVar26 = dVar1 * 1.0;
  dVar27 = dVar6 * dVar7;
  dVar28 = dVar8 * dVar9;
  dVar7 = dVar7 * dVar8;
  dVar9 = dVar6 * dVar9;
  dVar29 = dVar9 + dVar7 * 1.0;
  dVar30 = dVar29 * -1.0;
  dVar31 = dVar2 * (dVar27 - dVar28 * 1.0);
  dVar32 = dVar4 * (dVar28 * 1.0 - dVar27);
  dVar33 = dVar1 * dVar28 - dVar26 * dVar27;
  dVar34 = dVar3 * dVar28 - dVar24 * dVar27;
  dVar35 = dVar26 * -1.0 * dVar28 + dVar26 * dVar27;
  dVar36 = dVar24 * -1.0 * dVar28 + dVar24 * dVar27;
  dVar26 = dVar26 * (dVar9 + dVar7);
  dVar37 = dVar26 * -1.0;
  dVar38 = dVar24 * (dVar9 + dVar7);
  dVar39 = dVar38 * -1.0;
  dVar40 = dVar24 * -1.0 * dVar4 + dVar2 * dVar37;
  dVar24 = dVar4 * dVar26 + dVar2 * -1.0 * dVar24;
  dVar26 = dVar1 * dVar4 + dVar2 * dVar39;
  dVar38 = dVar1 * dVar2 + dVar4 * dVar38;
  dVar41 = dVar23 * dVar31 + dVar15 * dVar29 + dVar18 * dVar31 + dVar22 * dVar30;
  dVar42 = dVar23 * dVar40 + dVar18 * dVar40 + dVar15 * dVar35 + dVar22 * dVar33;
  dVar43 = dVar23 * dVar26 + dVar18 * dVar26 + dVar15 * dVar36 + dVar22 * dVar34;
  *eerot = dVar12 * dVar42 + dVar11 * dVar24;
  eerot[1] = dVar11 * -1.0 * dVar42 + dVar12 * dVar24;
  eerot[2] = dVar23 * dVar33 + dVar18 * -1.0 * dVar35 + dVar15 * dVar40 + dVar22 * -1.0 * dVar40;
  *eetrans = dVar5 * (dVar16 * dVar27 + dVar16 * -1.0 * dVar28) +
             dVar14 * -1.0 * dVar35 +
             dVar10 * (dVar2 * 5.39999999136e-06 * dVar37 + dVar3 * dVar4 * -5.39999999136e-06) +
             dVar10 * (dVar25 * dVar28 + dVar25 * -1.0 * dVar27 * 1.0) +
             dVar1 * 1.271 * dVar28 +
             dVar5 * (dVar3 * dVar4 * -2.159999996544e-10 + dVar2 * 2.159999996544e-10 * dVar37) +
             dVar21 * dVar33 +
             dVar19 * -1.0 * dVar40 +
             dVar17 * dVar9 +
             dVar17 * dVar7 +
             dVar1 * 1.271 * -1.0 * dVar27 * 1.0 + dVar13 * dVar40 + dVar1 * dVar6 * 1.095 + dVar17;
  eerot[3] = dVar12 * dVar43 + dVar11 * dVar38;
  eerot[4] = dVar11 * -1.0 * dVar43 + dVar12 * dVar38;
  eerot[5] = dVar23 * dVar34 + dVar18 * -1.0 * dVar36 + dVar15 * dVar26 + dVar22 * -1.0 * dVar26;
  eetrans[1] = dVar10 * (dVar2 * 5.39999999136e-06 * dVar39 + dVar16 * dVar4) +
               dVar14 * -1.0 * dVar36 +
               dVar3 * dVar6 * 1.095 +
               dVar10 * (dVar3 * 2.159999996544e-10 * -1.0 * dVar27 * 1.0 +
                        dVar3 * 2.159999996544e-10 * dVar28) +
               dVar20 * dVar7 +
               dVar20 * dVar9 +
               dVar21 * dVar34 +
               dVar5 * (dVar3 * 5.39999999136e-06 * dVar27 +
                       dVar3 * 5.39999999136e-06 * -1.0 * dVar28) +
               dVar19 * -1.0 * dVar26 +
               dVar3 * 1.271 * dVar28 +
               dVar5 * (dVar2 * 2.159999996544e-10 * dVar39 + dVar25 * dVar4) +
               dVar3 * 1.271 * -1.0 * dVar27 * 1.0 + dVar13 * dVar26 + dVar20;
  eerot[6] = dVar11 * dVar32 + dVar12 * dVar41;
  eerot[7] = dVar11 * -1.0 * dVar41 + dVar12 * dVar32;
  eerot[8] = dVar22 * -1.0 * dVar31 + dVar23 * dVar30 + dVar15 * dVar31 + dVar18 * -1.0 * dVar29;
  eetrans[2] = dVar14 * -1.0 * dVar29 +
               dVar10 * (dVar7 * -2.159999996544e-10 + dVar9 * -2.159999996544e-10) +
               dVar13 * dVar31 +
               dVar8 * 1.095 +
               dVar2 * dVar10 * (dVar27 * 5.39999999136e-06 + dVar28 * -5.39999999136e-06) +
               dVar2 * dVar5 * (dVar28 * -2.159999996544e-10 + dVar27 * 2.159999996544e-10) +
               dVar5 * (dVar9 * 5.39999999136e-06 + dVar7 * 5.39999999136e-06) +
               dVar7 * -1.271 +
               dVar9 * -1.271 +
               dVar21 * dVar30 + dVar28 * 0.175 + dVar19 * -1.0 * dVar31 + dVar27 * -0.175 + 0.495;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50,x51,x52,x53,x54,x55,x56,x57,x58,x59,x60,x61,x62,x63,x64;
x0=IKcos(j[0]);
x1=IKcos(j[3]);
x2=IKsin(j[0]);
x3=IKsin(j[3]);
x4=IKsin(j[4]);
x5=IKsin(j[1]);
x6=IKsin(j[2]);
x7=IKcos(j[1]);
x8=IKcos(j[2]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.134999999784)*x4);
x13=((5.39999999136e-6)*x4);
x14=((0.9999999992)*x4);
x15=((1.271)*x0);
x16=((1.271)*x2);
x17=((5.39999999136e-6)*x0);
x18=((0.175)*x0);
x19=((3.9999999968e-5)*x4);
x20=((5.39999999136e-6)*x9);
x21=((0.175)*x2);
x22=((0.134999999784)*x9);
x23=((3.9999999968e-5)*x9);
x24=((0.9999999992)*x9);
x25=((1.0)*x2);
x26=((5.39999999136e-6)*x1);
x27=((1.095)*x5);
x28=((2.159999996544e-10)*x0);
x29=((1.0)*x0);
x30=((2.159999996544e-10)*x2);
x31=((2.159999996544e-10)*x1);
x32=((5.39999999136e-6)*x2);
x33=(x5*x6);
x34=(x7*x8);
x35=(x1*x9);
x36=(x2*x3);
x37=(x6*x7);
x38=(x5*x8);
x39=((1.0)*x34);
x40=(x29*x33);
x41=(x25*x33);
x42=((((-1.0)*x39))+x33);
x43=((((-1.0)*x33))+x39);
x44=((((1.0)*x38))+(((1.0)*x37)));
x45=((-1.0)*x44);
x46=(x1*x42);
x47=(x3*x43);
x48=((((-1.0)*x40))+((x0*x34)));
x49=((((-1.0)*x41))+((x2*x34)));
x50=((((-1.0)*x29*x34))+x40);
x51=((((-1.0)*x25*x34))+x41);
x52=(x29*((x38+x37)));
x53=((-1.0)*x52);
x54=(x25*((x38+x37)));
x55=((-1.0)*x54);
x56=(x1*x55);
x57=((((-1.0)*x25*x3))+((x1*x53)));
x58=(((x3*x52))+(((-1.0)*x1*x25)));
x59=(((x0*x3))+x56);
x60=(((x0*x1))+((x3*x54)));
x61=(x4*x57);
x62=(((x19*x46))+((x23*x45))+((x14*x44))+((x24*x46)));
x63=(((x14*x50))+((x23*x48))+((x19*x57))+((x24*x57)));
x64=(((x14*x51))+((x23*x49))+((x19*x59))+((x24*x59)));
eerot[0]=(((x11*x63))+((x10*x58)));
eerot[1]=((((-1.0)*x10*x63))+((x11*x58)));
eerot[2]=(((x14*x57))+(((-1.0)*x23*x57))+(((-1.0)*x19*x50))+((x24*x48)));
IkReal x65=((1.0)*x33);
eetrans[0]=(((x12*x57))+((x0*x27))+(((-1.0)*x15*x65))+((x18*x37))+((x18*x38))+(((-1.0)*x20*x57))+((x22*x48))+((x4*(((((-2.159999996544e-10)*x36))+((x31*x53))))))+((x15*x34))+((x9*((((x28*x34))+(((-1.0)*x28*x65))))))+x18+((x9*((((x26*x53))+(((-5.39999999136e-6)*x36))))))+(((-1.0)*x13*x50))+((x4*((((x17*x33))+(((-1.0)*x17*x34)))))));
eerot[3]=(((x11*x64))+((x10*x60)));
eerot[4]=((((-1.0)*x10*x64))+((x11*x60)));
eerot[5]=(((x14*x59))+(((-1.0)*x23*x59))+(((-1.0)*x19*x51))+((x24*x49)));
IkReal x66=((1.0)*x33);
eetrans[1]=((((-1.0)*x16*x66))+((x12*x59))+((x4*((((x31*x55))+((x28*x3))))))+((x16*x34))+(((-1.0)*x20*x59))+((x4*((((x32*x33))+(((-1.0)*x32*x34))))))+((x22*x49))+((x21*x38))+((x21*x37))+((x9*(((((-1.0)*x30*x66))+((x30*x34))))))+((x2*x27))+x21+(((-1.0)*x13*x51))+((x9*((((x26*x55))+((x17*x3)))))));
eerot[6]=(((x10*x47))+((x11*x62)));
eerot[7]=((((-1.0)*x10*x62))+((x11*x47)));
eerot[8]=(((x14*x46))+(((-1.0)*x19*x44))+((x24*x45))+(((-1.0)*x23*x46)));
eetrans[2]=((0.495)+(((-0.175)*x33))+(((-1.0)*x20*x46))+(((0.175)*x34))+((x22*x45))+(((-1.271)*x38))+(((-1.271)*x37))+((x4*(((((5.39999999136e-6)*x38))+(((5.39999999136e-6)*x37))))))+((x1*x4*(((((-2.159999996544e-10)*x34))+(((2.159999996544e-10)*x33))))))+((x35*(((((5.39999999136e-6)*x33))+(((-5.39999999136e-6)*x34))))))+(((1.095)*x7))+((x12*x46))+((x9*(((((-2.159999996544e-10)*x37))+(((-2.159999996544e-10)*x38))))))+(((-1.0)*x13*x44)));
}